

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acceleration_stabilization.cpp
# Opt level: O2

int test(void)

{
  int iVar1;
  uint uVar2;
  Scalar *pSVar3;
  uint j;
  long index;
  double dVar4;
  Vector x0;
  Vector uk;
  undefined1 local_3a0 [88];
  IndexedMatrixArray u;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_340 [80];
  IndexedMatrixArray x;
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_2e8 [80];
  DynamicalSystemSimulator sim;
  IMUFixedContactDynamicalSystem imu;
  
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&x);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray(&u);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
  IMUFixedContactDynamicalSystem(&imu,0.005);
  stateObservation::DynamicalSystemSimulator::DynamicalSystemSimulator(&sim);
  stateObservation::DynamicalSystemSimulator::setDynamicsFunctor((DynamicalSystemFunctorBase *)&sim)
  ;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)local_3a0,0x12,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&x0,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_3a0);
  for (index = 0; index != 0x12; index = index + 1) {
    iVar1 = rand();
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)&x0,index);
    dVar4 = (double)iVar1 / 2147483647.0 + -0.5;
    *pSVar3 = dVar4 + dVar4;
  }
  stateObservation::DynamicalSystemSimulator::setState((Matrix *)&sim,(uint)&x0);
  uVar2 = stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::getInputSize();
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)local_3a0,(ulong)uVar2,1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&uk,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_3a0);
  for (uVar2 = 0; uVar2 != 2000; uVar2 = uVar2 + 1) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_3a0,
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&uk);
    stateObservation::IndexedMatrixArray::setValue(&u,(Matrix *)local_3a0,uVar2);
    free((void *)local_3a0._0_8_);
    stateObservation::DynamicalSystemSimulator::setInput
              ((Matrix *)&sim,(uint)(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&uk);
  }
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::setSamplingPeriod(0.005);
  stateObservation::DynamicalSystemSimulator::simulateDynamicsTo((uint)&sim);
  stateObservation::DynamicalSystemSimulator::getStateArray((uint)local_3a0,(uint)&sim);
  stateObservation::IndexedMatrixArray::operator=(&x,(IndexedMatrixArray *)local_3a0);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
            *)(local_3a0 + 8));
  stateObservation::IndexedMatrixArray::writeInFile((char *)&x);
  free(uk.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(x0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  stateObservation::DynamicalSystemSimulator::~DynamicalSystemSimulator(&sim);
  stateObservation::flexibilityEstimation::IMUFixedContactDynamicalSystem::
  ~IMUFixedContactDynamicalSystem(&imu);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_340);
  std::
  deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~deque(local_2e8);
  return 0;
}

Assistant:

int test()
{
    /// The number of samples
    const unsigned kmax=2000;

    ///sampling period
    const double dt=5e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=15;
    (void)measurementSize;
    (void)inputSize;


    for (unsigned i = 0; i<1; ++i)
    {
    	///The array containing all the states, the measurements and the inputs
    	IndexedMatrixArray x;
    	IndexedMatrixArray u;

        ///simulation of the signal
        /// the IMU dynamical system functor
        flexibilityEstimation::IMUFixedContactDynamicalSystem imu(dt);

        ///the simulator initalization
        DynamicalSystemSimulator sim;
        sim.setDynamicsFunctor( & imu); // choice of the dynamical system

        Vector x0=(Vector::Zero(stateSize,1));

        ///initialization of the state vector
        for (unsigned j= 0; j<stateSize ;++j)
        	x0[j]=(double(rand())/RAND_MAX -0.5)*2;

        sim.setState(x0,0);

        Vector uk=Vector::Zero(imu.getInputSize(),1);


        for (unsigned k=0;k<kmax;++k)
        {
        	u.setValue(uk,k);

            ///give the input to the simulator
            ///we only need to give one value and the
            ///simulator takes automatically the appropriate value
            sim.setInput(uk,k);
        }

        ///set the sampling perdiod to the functor
        imu.setSamplingPeriod(dt);

        sim.simulateDynamicsTo(kmax);

        x = sim.getStateArray(1,kmax);

        x.writeInFile("state.dat");
        //std::cout <<x[kmax].norm ()<< " "<< x[kmax].transpose() << std::endl;
    }

    return 0;

}